

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<std::__cxx11::string>
          (ObjectPool<spirv_cross::SPIRString> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  Vector<spirv_cross::SPIRString_*> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
  _Var3;
  size_type *psVar4;
  _Head_base<0UL,_spirv_cross::SPIRString_*,_false> _Var5;
  size_t sVar6;
  ulong uVar7;
  SPIRString *pSVar8;
  size_type local_40;
  undefined8 uStack_38;
  
  this_00 = &this->vacants;
  sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
  if (sVar6 == 0) {
    sVar6 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            .buffer_size;
    uVar7 = (ulong)(this->start_object_count << ((byte)sVar6 & 0x1f));
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRString_*,_false>)malloc(uVar7 * 0x30);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl ==
        (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    if (uVar7 != 0) {
      sVar6 = 0;
      _Var5._M_head_impl =
           (SPIRString *)_Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRString_*,_0UL>::reserve(this_00,sVar6 + 1);
        sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar6] = _Var5._M_head_impl;
        sVar6 = sVar6 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size = sVar6;
        _Var5._M_head_impl = _Var5._M_head_impl + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      sVar6 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar6 + 1);
    sVar6 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
    .ptr[sVar6]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRString_*,_false> =
         _Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
    .buffer_size = sVar6 + 1;
    sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
    pSVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar6 - 1];
    if (sVar6 == 0) goto LAB_003456fd;
  }
  else {
    pSVar8 = (this_00->super_VectorView<spirv_cross::SPIRString_*>).ptr[sVar6 - 1];
  }
  SmallVector<spirv_cross::SPIRString_*,_0UL>::resize(this_00,sVar6 - 1);
LAB_003456fd:
  psVar4 = (size_type *)(p->_M_dataplus)._M_p;
  paVar1 = &p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4 == paVar1) {
    local_40 = paVar1->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&p->field_2 + 8);
    psVar4 = &local_40;
  }
  else {
    local_40 = paVar1->_M_allocated_capacity;
  }
  sVar2 = p->_M_string_length;
  (p->_M_dataplus)._M_p = (pointer)paVar1;
  p->_M_string_length = 0;
  (p->field_2)._M_local_buf[0] = '\0';
  (pSVar8->super_IVariant).self.id = 0;
  (pSVar8->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_003fa888;
  paVar1 = &(pSVar8->str).field_2;
  (pSVar8->str)._M_dataplus._M_p = (pointer)paVar1;
  if (psVar4 == &local_40) {
    paVar1->_M_allocated_capacity = local_40;
    *(undefined8 *)((long)&(pSVar8->str).field_2 + 8) = uStack_38;
  }
  else {
    (pSVar8->str)._M_dataplus._M_p = (pointer)psVar4;
    (pSVar8->str).field_2._M_allocated_capacity = local_40;
  }
  (pSVar8->str)._M_string_length = sVar2;
  return pSVar8;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}